

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::processAsciiWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  char local_21;
  
  if (*(word->_M_dataplus)._M_p == '+') {
    if ((int)word->_M_string_length < 3) {
      std::__ostream_insert<char,std::char_traits<char>>(out,&local_21,1);
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," at token: ",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    pcVar3 = "character byte word is too long -- specify only one character";
    lVar2 = 0x3d;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line ",0xe);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," at token: ",0xb);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,(word->_M_dataplus)._M_p,word->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    pcVar3 = "character byte must start with \'+\' sign: ";
    lVar2 = 0x29;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processAsciiWord(std::ostream& out, const std::string& word,
		int lineNum) {
	int length = (int)word.size();
	uchar outputByte;

	if (word[0] != '+') {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "character byte must start with \'+\' sign: " << std::endl;
		return 0;
	}

	if (length > 2) {
		std::cerr << "Error on line " << lineNum << " at token: " << word << std::endl;
		std::cerr << "character byte word is too long -- specify only one character"
			  << std::endl;
		return 0;
	}

	if (length == 2) {
		outputByte = (uchar)word[1];
	} else {
		outputByte = ' ';
	}
	out << outputByte;
	return 1;
}